

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XorHandler.h
# Opt level: O0

bool __thiscall TCLAP::XorHandler::contains(XorHandler *this,Arg *a)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference ppAVar5;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_38;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_30;
  ArgVectorIterator it;
  int i;
  Arg *a_local;
  XorHandler *this_local;
  
  it._M_current._4_4_ = 0;
  do {
    uVar2 = (ulong)it._M_current._4_4_;
    sVar3 = std::
            vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            ::size(&this->_orList);
    if (sVar3 <= uVar2) {
      return false;
    }
    pvVar4 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[](&this->_orList,(long)(int)it._M_current._4_4_);
    local_30._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar4);
    while( true ) {
      pvVar4 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[](&this->_orList,(long)(int)it._M_current._4_4_);
      local_38._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar4);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      ppAVar5 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_30);
      if (a == *ppAVar5) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>::
      operator++(&local_30,0);
    }
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  } while( true );
}

Assistant:

inline bool XorHandler::contains( const Arg* a )
{
	for ( int i = 0; static_cast<unsigned int>(i) < _orList.size(); i++ )
		for ( ArgVectorIterator it = _orList[i].begin(); 
			  it != _orList[i].end(); 
			  it++ )	
			if ( a == (*it) )
				return true;

	return false;
}